

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRUndef * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::allocate<unsigned_int&>
          (ObjectPool<spirv_cross::SPIRUndef> *this,uint *p)

{
  Vector<spirv_cross::SPIRUndef_*> *this_00;
  uint uVar1;
  size_t sVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRUndef_*,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
  _Var3;
  _Head_base<0UL,_spirv_cross::SPIRUndef_*,_false> _Var4;
  ulong count;
  SPIRUndef *pSVar5;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>)malloc(count << 4);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl !=
        (SPIRUndef *)0x0) {
      SmallVector<spirv_cross::SPIRUndef_*,_0UL>::reserve(this_00,count);
      _Var4._M_head_impl =
           (SPIRUndef *)_Var3.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRUndef_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size +
                           1);
        sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.ptr[sVar2] = _Var4._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size = sVar2 + 1;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
                .buffer_size + 1);
      sVar2 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRUndef_*,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false> =
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRUndef,_spirv_cross::ObjectPool<spirv_cross::SPIRUndef>::MallocDeleter>_>
      .buffer_size = sVar2 + 1;
      if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRUndef_*,_false>._M_head_impl !=
          (SPIRUndef *)0x0) goto LAB_003a3fe0;
    }
    pSVar5 = (SPIRUndef *)0x0;
  }
  else {
LAB_003a3fe0:
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRUndef_*>.ptr[sVar2 - 1];
    if (sVar2 != 0) {
      SmallVector<spirv_cross::SPIRUndef_*,_0UL>::resize(this_00,sVar2 - 1);
    }
    uVar1 = *p;
    (pSVar5->super_IVariant).self.id = 0;
    (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0050c5a8;
    *(uint *)&(pSVar5->super_IVariant).field_0xc = uVar1;
  }
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}